

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Persistent_cohomology.h
# Opt level: O1

void __thiscall
Gudhi::persistent_cohomology::
Persistent_cohomology<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>,_Gudhi::persistent_cohomology::Field_Zp>
::destroy_cocycle(Persistent_cohomology<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>,_Gudhi::persistent_cohomology::Field_Zp>
                  *this,Simplex_handle *sigma,A_ds_type *a_ds,Simplex_key death_key,
                 Arith_element inv_x,Arith_element charac)

{
  Col_type *this_00;
  Filtration_value *pFVar1;
  Cam *value;
  pointer pvVar2;
  pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>_>
  *ppVar3;
  _Base_ptr p_Var4;
  Column *target;
  undefined8 *puVar5;
  long lVar6;
  long *plVar7;
  undefined1 *puVar8;
  node_ptr plVar9;
  uint *puVar10;
  int *piVar11;
  _Base_ptr p_Var12;
  _Base_ptr p_Var13;
  anon_class_8_1_8991fb9c aVar14;
  undefined8 uVar15;
  Element w;
  node_ptr to_erase;
  _Base_ptr p_Var16;
  mapped_type *pmVar17;
  _Base_ptr p_Var18;
  char *__function;
  uint uVar19;
  uint uVar20;
  iterator __position;
  ulong uVar21;
  Filtration_value *pFVar22;
  Filtration_value *pFVar23;
  ulong uVar24;
  uint uVar25;
  uint uVar26;
  uint uVar27;
  bool bVar28;
  float fVar29;
  Arith_element local_9c;
  anon_class_8_1_8991fb9c local_98;
  _Base_ptr local_90;
  _Base_ptr local_88;
  Arith_element local_7c;
  undefined1 local_78 [40];
  A_ds_type *local_50;
  Field_Zp *local_48;
  Column *local_40;
  Simplex_tree_siblings<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>,_boost::container::flat_map<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>,_std::less<int>,_void>_>
  *local_38;
  
  pvVar2 = (this->cpx_->filtration_vect_).
           super__Vector_base<boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>_>_*,_true>,_std::allocator<boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>_>_*,_true>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pFVar22 = (Filtration_value *)&sigma->m_ptr->second;
  if (sigma->m_ptr ==
      (pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>_>
       *)0x0) {
    pFVar22 = &Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>::
               Filtration_simplex_base_real::inf_;
  }
  ppVar3 = pvVar2[death_key].m_ptr;
  pFVar23 = (Filtration_value *)&ppVar3->second;
  if (ppVar3 == (pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>_>
                 *)0x0) {
    pFVar23 = &Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>::
               Filtration_simplex_base_real::inf_;
  }
  fVar29 = (((Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>
              *)pFVar22)->super_Filtration_simplex_base).filt_ -
           (((Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>
              *)pFVar23)->super_Filtration_simplex_base).filt_;
  pFVar1 = &(this->interval_length_policy).min_length_;
  local_9c = charac;
  local_7c = inv_x;
  local_50 = a_ds;
  if (*pFVar1 <= fVar29 && fVar29 != *pFVar1) {
    local_78._0_8_ = pvVar2[death_key].m_ptr;
    std::
    vector<std::tuple<boost::container::vec_iterator<std::pair<int,Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>>>*,true>,boost::container::vec_iterator<std::pair<int,Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>>>*,true>,int>,std::allocator<std::tuple<boost::container::vec_iterator<std::pair<int,Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>>>*,true>,boost::container::vec_iterator<std::pair<int,Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>>>*,true>,int>>>
    ::
    emplace_back<boost::container::vec_iterator<std::pair<int,Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>>>*,true>,boost::container::vec_iterator<std::pair<int,Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>>>*,true>&,int&>
              ((vector<std::tuple<boost::container::vec_iterator<std::pair<int,Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>>>*,true>,boost::container::vec_iterator<std::pair<int,Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>>>*,true>,int>,std::allocator<std::tuple<boost::container::vec_iterator<std::pair<int,Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>>>*,true>,boost::container::vec_iterator<std::pair<int,Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>>>*,true>,int>>>
                *)&this->persistent_pairs_,
               (vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>_>_*,_true>
                *)local_78,sigma,&local_9c);
  }
  __position._M_node = &(this->transverse_idx_)._M_t._M_impl.super__Rb_tree_header._M_header;
  p_Var16 = __position._M_node;
  for (p_Var4 = (this->transverse_idx_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
      p_Var4 != (_Base_ptr)0x0; p_Var4 = (&p_Var4->_M_left)[bVar28]) {
    bVar28 = p_Var4[1]._M_color < death_key;
    if (!bVar28) {
      p_Var16 = p_Var4;
    }
  }
  if ((p_Var16 != __position._M_node) && (p_Var16[1]._M_color <= death_key)) {
    __position._M_node = p_Var16;
  }
  local_78._16_8_ = &this->transverse_idx_;
  p_Var18 = *(_Base_ptr *)__position._M_node[1]._M_parent;
  local_98.this = this;
  local_78._24_8_ = sigma;
  if (p_Var18 != __position._M_node[1]._M_parent) {
    local_48 = &this->coeff_field_;
    value = &this->cam_;
    local_90 = __position._M_node;
    local_78._32_8_ = value;
    do {
      if (p_Var18 == (_Base_ptr)0x0) {
        __function = 
        "static pointer boost::intrusive::bhtraits_base<Gudhi::persistent_cohomology::Persistent_cohomology_cell<unsigned int, int>, boost::intrusive::list_node<void *> *, Gudhi::persistent_cohomology::cam_h_tag, 1>::to_value_ptr(const node_ptr &) [T = Gudhi::persistent_cohomology::Persistent_cohomology_cell<unsigned int, int>, NodePtr = boost::intrusive::list_node<void *> *, Tag = Gudhi::persistent_cohomology::cam_h_tag, Type = 1]"
        ;
LAB_0011e6ca:
        __assert_fail("!!p","/usr/include/boost/intrusive/detail/hook_traits.hpp",0x3e,__function);
      }
      w = Field_Zp::times_minus(local_48,local_7c,*(Element *)&p_Var18[1].field_0x4);
      if (w == 0) {
        p_Var18 = *(_Base_ptr *)p_Var18;
      }
      else {
        local_88 = *(_Base_ptr *)p_Var18;
        target = (Column *)p_Var18[1]._M_parent;
        this_00 = &target->col_;
        for (puVar5 = *(undefined8 **)
                       &(target->col_).super_type.data_.root_plus_size_.m_header.super_node;
            (Col_type *)puVar5 != this_00; puVar5 = (undefined8 *)*puVar5) {
          lVar6 = puVar5[-2];
          if (lVar6 != 0) {
            plVar7 = (long *)puVar5[-1];
            *plVar7 = lVar6;
            *(long **)(lVar6 + 8) = plVar7;
            puVar5[-2] = 0;
            puVar5[-1] = 0;
          }
        }
        local_40 = target;
        boost::intrusive::
        bstree_impl<boost::intrusive::bhtraits<Gudhi::persistent_cohomology::Persistent_cohomology_column<unsigned_int,_int>,_boost::intrusive::rbtree_node_traits<void_*,_false>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_void,_unsigned_long,_false,_(boost::intrusive::algo_types)5,_void>
        ::erase((bstree_impl<boost::intrusive::bhtraits<Gudhi::persistent_cohomology::Persistent_cohomology_column<unsigned_int,_int>,_boost::intrusive::rbtree_node_traits<void_*,_false>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_void,_unsigned_long,_false,_(boost::intrusive::algo_types)5,_void>
                 *)local_78,(const_iterator *)value);
        aVar14.this = local_98.this;
        plus_equal_column(local_98.this,target,local_50,w);
        puVar8 = *(undefined1 **)
                  &(target->col_).super_type.data_.root_plus_size_.m_header.super_node;
        if ((Col_type *)puVar8 == this_00 || puVar8 == (undefined1 *)0x0) {
          ((aVar14.this)->ds_repr_).
          super__Vector_base<Gudhi::persistent_cohomology::Persistent_cohomology_column<unsigned_int,_int>_*,_std::allocator<Gudhi::persistent_cohomology::Persistent_cohomology_column<unsigned_int,_int>_*>_>
          ._M_impl.super__Vector_impl_data._M_start[target->class_key_] =
               (Persistent_cohomology_column<unsigned_int,_int> *)0x0;
          (target->
          super_set_base_hook<boost::intrusive::link_mode<(boost::intrusive::link_mode_type)0>_>).
          super_type.super_type.super_rbtree_node<void_*>.parent_ =
               ((aVar14.this)->column_pool_).super_pool<boost::default_user_allocator_malloc_free>.
               super_simple_segregated_storage<unsigned_long>.first;
          ((aVar14.this)->column_pool_).super_pool<boost::default_user_allocator_malloc_free>.
          super_simple_segregated_storage<unsigned_long>.first = target;
          p_Var18 = local_88;
          __position._M_node = local_90;
        }
        else {
          boost::intrusive::
          bstree_impl<boost::intrusive::bhtraits<Gudhi::persistent_cohomology::Persistent_cohomology_column<unsigned_int,_int>,_boost::intrusive::rbtree_node_traits<void_*,_false>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_void,_unsigned_long,_false,_(boost::intrusive::algo_types)5,_void>
          ::insert_unique((bstree_impl<boost::intrusive::bhtraits<Gudhi::persistent_cohomology::Persistent_cohomology_column<unsigned_int,_int>,_boost::intrusive::rbtree_node_traits<void_*,_false>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_void,_unsigned_long,_false,_(boost::intrusive::algo_types)5,_void>
                           *)local_78,(reference)value);
          uVar15 = local_78._16_8_;
          aVar14.this = local_98.this;
          if (local_78[8] == '\x01') {
            for (plVar9 = (this_00->super_type).data_.root_plus_size_.m_header.super_node.next_;
                p_Var18 = local_88, __position._M_node = local_90, plVar9 != (node_ptr)this_00;
                plVar9 = plVar9->next_) {
              pmVar17 = std::
                        map<unsigned_int,_Gudhi::persistent_cohomology::Persistent_cohomology<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>,_Gudhi::persistent_cohomology::Field_Zp>::cocycle,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_Gudhi::persistent_cohomology::Persistent_cohomology<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>,_Gudhi::persistent_cohomology::Field_Zp>::cocycle>_>_>
                        ::operator[]((map<unsigned_int,_Gudhi::persistent_cohomology::Persistent_cohomology<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>,_Gudhi::persistent_cohomology::Field_Zp>::cocycle,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_Gudhi::persistent_cohomology::Persistent_cohomology<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>,_Gudhi::persistent_cohomology::Field_Zp>::cocycle>_>_>
                                      *)uVar15,(key_type_conflict *)(plVar9 + 1));
              boost::intrusive::
              list_impl<boost::intrusive::bhtraits<Gudhi::persistent_cohomology::Persistent_cohomology_cell<unsigned_int,_int>,_boost::intrusive::list_node_traits<void_*>,_(boost::intrusive::link_mode_type)2,_Gudhi::persistent_cohomology::cam_h_tag,_1U>,_unsigned_long,_false,_void>
              ::push_front(&pmVar17->row_->super_type,(reference)(plVar9 + 0xffffffffffffffff));
            }
          }
          else {
            if ((Persistent_cohomology_column<unsigned_int,_int> *)local_78._0_8_ ==
                (Persistent_cohomology_column<unsigned_int,_int> *)0x0) {
              __function = 
              "static pointer boost::intrusive::bhtraits_base<Gudhi::persistent_cohomology::Persistent_cohomology_column<unsigned int, int>, boost::intrusive::rbtree_node<void *> *, boost::intrusive::dft_tag, 3>::to_value_ptr(const node_ptr &) [T = Gudhi::persistent_cohomology::Persistent_cohomology_column<unsigned int, int>, NodePtr = boost::intrusive::rbtree_node<void *> *, Tag = boost::intrusive::dft_tag, Type = 3]"
              ;
              goto LAB_0011e6ca;
            }
            uVar21 = (ulong)target->class_key_;
            puVar10 = ((local_98.this)->dsets_).parent;
            uVar27 = puVar10[uVar21];
            uVar19 = uVar27;
            uVar20 = uVar27;
            if (uVar27 != target->class_key_) {
              do {
                uVar20 = puVar10[uVar19];
                bVar28 = uVar20 != uVar19;
                uVar19 = uVar20;
              } while (bVar28);
            }
            uVar19 = ((pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>_>
                       *)(local_78._0_8_ + 0x30))->first;
            uVar24 = (ulong)uVar19;
            piVar11 = ((local_98.this)->dsets_).rank;
            for (; uVar20 != uVar27; uVar27 = puVar10[uVar27]) {
              puVar10[uVar21] = uVar20;
              uVar21 = (ulong)uVar27;
            }
            uVar27 = puVar10[uVar24];
            uVar25 = uVar27;
            uVar26 = uVar27;
            if (uVar27 != uVar19) {
              do {
                uVar26 = puVar10[uVar25];
                bVar28 = uVar26 != uVar25;
                uVar25 = uVar26;
              } while (bVar28);
            }
            for (; uVar26 != uVar27; uVar27 = puVar10[uVar27]) {
              puVar10[uVar24] = uVar26;
              uVar24 = (ulong)uVar27;
            }
            if (uVar20 != uVar26) {
              if (piVar11[uVar26] < piVar11[uVar20]) {
                puVar10[uVar26] = uVar20;
              }
              else {
                puVar10[uVar20] = uVar26;
                if (piVar11[uVar20] == piVar11[uVar26]) {
                  piVar11[uVar26] = piVar11[uVar26] + 1;
                }
              }
            }
            uVar21 = (ulong)target->class_key_;
            uVar27 = puVar10[uVar21];
            uVar19 = uVar27;
            uVar20 = uVar27;
            if (uVar27 != target->class_key_) {
              do {
                uVar20 = puVar10[uVar19];
                bVar28 = uVar20 != uVar19;
                uVar19 = uVar20;
              } while (bVar28);
            }
            for (; uVar20 != uVar27; uVar27 = puVar10[uVar27]) {
              puVar10[uVar21] = uVar20;
              uVar21 = (ulong)uVar27;
            }
            ((local_98.this)->ds_repr_).
            super__Vector_base<Gudhi::persistent_cohomology::Persistent_cohomology_column<unsigned_int,_int>_*,_std::allocator<Gudhi::persistent_cohomology::Persistent_cohomology_column<unsigned_int,_int>_*>_>
            ._M_impl.super__Vector_impl_data._M_start[uVar20] =
                 (Persistent_cohomology_column<unsigned_int,_int> *)local_78._0_8_;
            ((pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>_>
              *)(local_78._0_8_ + 0x30))->first = uVar20;
            boost::intrusive::
            list_impl<boost::intrusive::bhtraits<Gudhi::persistent_cohomology::Persistent_cohomology_cell<unsigned_int,int>,boost::intrusive::list_node_traits<void*>,(boost::intrusive::link_mode_type)0,Gudhi::persistent_cohomology::cam_v_tag,1u>,unsigned_long,false,void>
            ::
            clear_and_dispose<Gudhi::persistent_cohomology::Persistent_cohomology<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>,Gudhi::persistent_cohomology::Field_Zp>::destroy_cocycle(boost::container::vec_iterator<std::pair<int,Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>>>*,true>,std::vector<std::pair<unsigned_int,int>,std::allocator<std::pair<unsigned_int,int>>>const&,unsigned_int,int,int)::_lambda(Gudhi::persistent_cohomology::Persistent_cohomology_cell<unsigned_int,int>*)_1_>
                      (&this_00->super_type,local_98);
            (target->
            super_set_base_hook<boost::intrusive::link_mode<(boost::intrusive::link_mode_type)0>_>).
            super_type.super_type.super_rbtree_node<void_*>.parent_ =
                 ((aVar14.this)->column_pool_).super_pool<boost::default_user_allocator_malloc_free>
                 .super_simple_segregated_storage<unsigned_long>.first;
            ((aVar14.this)->column_pool_).super_pool<boost::default_user_allocator_malloc_free>.
            super_simple_segregated_storage<unsigned_long>.first = target;
            p_Var18 = local_88;
            __position._M_node = local_90;
          }
        }
      }
    } while (p_Var18 != __position._M_node[1]._M_parent);
  }
  if (local_9c == ((local_98.this)->coeff_field_).Prime) {
    local_38 = (Simplex_tree_siblings<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>,_boost::container::flat_map<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>,_std::less<int>,_void>_>
                *)*(pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>_>
                    **)local_78._24_8_;
    Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>::_to_node_it
              ((Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence> *)local_78,
               (Simplex_handle *)(local_98.this)->cpx_);
    (((Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>
       *)(local_78._0_8_ + 8))->super_Key_simplex_base).key_ = 0xffffffff;
  }
  uVar15 = local_78._16_8_;
  if (*(int *)&__position._M_node[1]._M_left == local_9c) {
    p_Var18 = __position._M_node[1]._M_parent;
    if (p_Var18 != (_Base_ptr)0x0) {
      p_Var13 = *(_Base_ptr *)p_Var18;
      while (p_Var13 != p_Var18) {
        p_Var12 = *(_Base_ptr *)p_Var13;
        *(undefined8 *)p_Var13 = 0;
        p_Var13->_M_parent = (_Base_ptr)0x0;
        p_Var13 = p_Var12;
      }
      *(undefined8 *)p_Var18 = 0;
      p_Var18->_M_parent = (_Base_ptr)0x0;
      operator_delete(p_Var18,0x10);
    }
    std::
    _Rb_tree<unsigned_int,std::pair<unsigned_int_const,Gudhi::persistent_cohomology::Persistent_cohomology<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>,Gudhi::persistent_cohomology::Field_Zp>::cocycle>,std::_Select1st<std::pair<unsigned_int_const,Gudhi::persistent_cohomology::Persistent_cohomology<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>,Gudhi::persistent_cohomology::Field_Zp>::cocycle>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,Gudhi::persistent_cohomology::Persistent_cohomology<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>,Gudhi::persistent_cohomology::Field_Zp>::cocycle>>>
    ::erase_abi_cxx11_((_Rb_tree<unsigned_int,std::pair<unsigned_int_const,Gudhi::persistent_cohomology::Persistent_cohomology<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>,Gudhi::persistent_cohomology::Field_Zp>::cocycle>,std::_Select1st<std::pair<unsigned_int_const,Gudhi::persistent_cohomology::Persistent_cohomology<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>,Gudhi::persistent_cohomology::Field_Zp>::cocycle>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,Gudhi::persistent_cohomology::Persistent_cohomology<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>,Gudhi::persistent_cohomology::Field_Zp>::cocycle>>>
                        *)uVar15,__position);
  }
  else {
    *(int *)&__position._M_node[1]._M_left = *(int *)&__position._M_node[1]._M_left / local_9c;
  }
  return;
}

Assistant:

void destroy_cocycle(Simplex_handle sigma, A_ds_type const& a_ds,
                       Simplex_key death_key, Arith_element inv_x,
                       Arith_element charac) {
    // Create a finite persistent interval for which the interval exists
    if (interval_length_policy(cpx_->simplex(death_key), sigma)) {
      persistent_pairs_.emplace_back(cpx_->simplex(death_key)  // creator
          , sigma                                              // destructor
          , charac);                                           // fields
    }

    auto death_key_row = transverse_idx_.find(death_key);  // Find the beginning of the row.
    std::pair<typename Cam::iterator, bool> result_insert_cam;

    auto row_cell_it = death_key_row->second.row_->begin();

    while (row_cell_it != death_key_row->second.row_->end()) {  // Traverse all cells in
      // the row at index death_key.
      Arith_element w = coeff_field_.times_minus(inv_x, row_cell_it->coefficient_);

      if (w != coeff_field_.additive_identity()) {
        Column * curr_col = row_cell_it->self_col_;
        ++row_cell_it;
        // Disconnect the column from the rows in the CAM.
        for (auto& col_cell : curr_col->col_) {
          col_cell.base_hook_cam_h::unlink();
        }

        // Remove the column from the CAM before modifying its value
        cam_.erase(cam_.iterator_to(*curr_col));
        // Proceed to the reduction of the column
        plus_equal_column(*curr_col, a_ds, w);

        if (curr_col->col_.empty()) {  // If the column is null
          ds_repr_[curr_col->class_key_] = NULL;
          column_pool_.destroy(curr_col);  // delete curr_col;
        } else {
          // Find whether the column obtained is already in the CAM
          result_insert_cam = cam_.insert(*curr_col);
          if (result_insert_cam.second) {  // If it was not in the CAM before: insertion has succeeded
            for (auto& col_cell : curr_col->col_) {
              // re-establish the row links
              transverse_idx_[col_cell.key_].row_->push_front(col_cell);
            }
          } else {  // There is already an identical column in the CAM:
            // merge two disjoint sets.
            dsets_.link(curr_col->class_key_,
                        result_insert_cam.first->class_key_);

            Simplex_key key_tmp = dsets_.find_set(curr_col->class_key_);
            ds_repr_[key_tmp] = &(*(result_insert_cam.first));
            result_insert_cam.first->class_key_ = key_tmp;
            // intrusive containers don't own their elements, we have to release them manually
            curr_col->col_.clear_and_dispose([&](Cell*p){cell_pool_.destroy(p);});
            column_pool_.destroy(curr_col);  // delete curr_col;
          }
        }
      } else {
        ++row_cell_it;
      }  // If w == 0, pass.
    }

    // Because it is a killer simplex, set the data of sigma to null_key().
    if (charac == coeff_field_.characteristic()) {
      cpx_->assign_key(sigma, cpx_->null_key());
    }
    if (death_key_row->second.characteristics_ == charac) {
      delete death_key_row->second.row_;
      transverse_idx_.erase(death_key_row);
    } else {
      death_key_row->second.characteristics_ /= charac;
    }
  }